

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_add2hash(FIOBJ dest,char *name,size_t name_len,char *value,size_t value_len,uint8_t encoded
                 )

{
  int iVar1;
  FIOBJ val;
  ulong num;
  double num_00;
  char *end;
  char *local_38;
  
  if (value_len == 5) {
    iVar1 = strncasecmp(value,anon_var_dwarf_217,5);
    if (iVar1 == 0) {
      val = 0x26;
      goto LAB_0014af69;
    }
  }
  else if (value_len == 4) {
    iVar1 = strncasecmp(value,anon_var_dwarf_222,4);
    if (iVar1 == 0) {
      val = 0x16;
      goto LAB_0014af69;
    }
    iVar1 = strncasecmp(value,anon_var_dwarf_20c,4);
    if (iVar1 == 0) {
      val = 6;
      goto LAB_0014af69;
    }
  }
  else if (value_len == 0) {
    val = fiobj_str_new((char *)0x0,0);
    goto LAB_0014af69;
  }
  local_38 = value;
  num = fio_atol(&local_38);
  if (local_38 == value + value_len) {
    if ((long)(num + 0x4000000000000000) < 0) {
      val = fiobj_num_new_bignum(num);
    }
    else {
      val = (num * 2 | num & 0x8000000000000000) + 1;
    }
  }
  else {
    local_38 = value;
    num_00 = fio_atof(&local_38);
    if (local_38 == value + value_len) {
      val = fiobj_float_new(num_00);
    }
    else if (encoded == '\0') {
      val = fiobj_str_new(value,value_len);
    }
    else {
      val = http_urlstr2fiobj(value,value_len);
    }
  }
LAB_0014af69:
  iVar1 = http_add2hash2(dest,name,name_len,val,encoded);
  return iVar1;
}

Assistant:

int http_add2hash(FIOBJ dest, char *name, size_t name_len, char *value,
                  size_t value_len, uint8_t encoded) {
  return http_add2hash2(dest, name, name_len,
                        http_str2fiobj(value, value_len, encoded), encoded);
}